

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace.h
# Opt level: O1

bool __thiscall snestistics::DmaTransfer::operator<(DmaTransfer *this,DmaTransfer *o)

{
  bool bVar1;
  
  bVar1 = this->pc < o->pc;
  if ((((this->pc == o->pc) && (bVar1 = this->channel < o->channel, this->channel == o->channel)) &&
      (bVar1 = this->a_address < o->a_address, this->a_address == o->a_address)) &&
     (((bVar1 = this->transfer_bytes < o->transfer_bytes, this->transfer_bytes == o->transfer_bytes
       && (bVar1 = this->transfer_mode < o->transfer_mode, this->transfer_mode == o->transfer_mode))
      && ((bVar1 = this->a_bank < o->a_bank, this->a_bank == o->a_bank &&
          (bVar1 = this->flags < o->flags, this->flags == o->flags)))))) {
    bVar1 = this->wram < o->wram;
  }
  return bVar1;
}

Assistant:

bool operator<(const DmaTransfer &o) const {
		if (pc != o.pc) return pc<o.pc;
		if (channel != o.channel) return channel<o.channel;
		if (a_address != o.a_address) return a_address<o.a_address;
		if (transfer_bytes != o.transfer_bytes) return transfer_bytes<o.transfer_bytes;
		if (transfer_mode != o.transfer_mode) return transfer_mode<o.transfer_mode;
		if (a_bank != o.a_bank) return a_bank<o.a_bank;
		if (flags != o.flags) return flags < o.flags;
		if (wram != o.wram) return wram < o.wram;
		return false;
	}